

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ulong unaff_RBP;
  undefined8 uVar70;
  ulong uVar71;
  secp256k1_ge *a_00;
  undefined8 uVar72;
  secp256k1_ge *psVar73;
  secp256k1_fe *psVar74;
  secp256k1_ge *r_00;
  secp256k1_ge *a_01;
  ulong uVar75;
  secp256k1_fe *psVar76;
  ulong unaff_R15;
  undefined1 auVar77 [16];
  undefined1 auStack_130 [56];
  uint64_t uStack_f8;
  uint64_t uStack_f0;
  uint64_t uStack_e8;
  uint64_t uStack_e0;
  undefined8 uStack_d8;
  int iStack_d4;
  secp256k1_fe *psStack_d0;
  secp256k1_fe *psStack_c8;
  code *pcStack_c0;
  undefined8 local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  ulong local_78;
  secp256k1_fe *local_70;
  ulong local_68;
  secp256k1_fe *local_60;
  ulong local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 local_40;
  ulong local_38;
  
  pcStack_c0 = (code *)0x13f48b;
  secp256k1_fe_verify(a);
  pcStack_c0 = (code *)0x13f493;
  secp256k1_fe_verify(b);
  pcStack_c0 = (code *)0x13f4a0;
  secp256k1_fe_verify_magnitude(a,8);
  uVar71 = 8;
  pcStack_c0 = (code *)0x13f4ad;
  psVar74 = b;
  secp256k1_fe_verify_magnitude(b,8);
  if (r == b) {
    pcStack_c0 = (code *)0x13f983;
    secp256k1_fe_mul_cold_16();
LAB_0013f983:
    pcStack_c0 = (code *)0x13f988;
    secp256k1_fe_mul_cold_15();
LAB_0013f988:
    pcStack_c0 = (code *)0x13f98d;
    secp256k1_fe_mul_cold_14();
LAB_0013f98d:
    pcStack_c0 = (code *)0x13f992;
    secp256k1_fe_mul_cold_13();
LAB_0013f992:
    pcStack_c0 = (code *)0x13f997;
    secp256k1_fe_mul_cold_12();
LAB_0013f997:
    pcStack_c0 = (code *)0x13f99c;
    secp256k1_fe_mul_cold_11();
LAB_0013f99c:
    pcStack_c0 = (code *)0x13f9a1;
    secp256k1_fe_mul_cold_10();
LAB_0013f9a1:
    pcStack_c0 = (code *)0x13f9a6;
    secp256k1_fe_mul_cold_9();
LAB_0013f9a6:
    pcStack_c0 = (code *)0x13f9ab;
    secp256k1_fe_mul_cold_8();
LAB_0013f9ab:
    pcStack_c0 = (code *)0x13f9b0;
    secp256k1_fe_mul_cold_7();
LAB_0013f9b0:
    pcStack_c0 = (code *)0x13f9b5;
    secp256k1_fe_mul_cold_6();
    uVar68 = unaff_RBP;
LAB_0013f9b5:
    pcStack_c0 = (code *)0x13f9ba;
    secp256k1_fe_mul_cold_5();
    auVar62._8_8_ = local_80;
    auVar62._0_8_ = local_b8;
    auVar61._8_8_ = local_a0;
    auVar61._0_8_ = local_40;
    auVar77._8_8_ = uVar71;
    auVar77._0_8_ = psVar74;
    psVar76 = r;
LAB_0013f9ba:
    local_80 = auVar62._8_8_;
    local_b8 = auVar62._0_8_;
    local_a0 = auVar61._8_8_;
    local_40 = auVar61._0_8_;
    auVar65._8_8_ = psVar76;
    auVar65._0_8_ = unaff_R15;
    pcStack_c0 = (code *)0x13f9bf;
    secp256k1_fe_mul_cold_4();
    auVar62._8_8_ = local_80;
    auVar62._0_8_ = local_b8;
    auVar61._8_8_ = local_a0;
    auVar61._0_8_ = local_40;
    auVar63._8_8_ = auVar77._8_8_;
    auVar63._0_8_ = uVar68;
    psVar76 = auVar77._0_8_;
LAB_0013f9bf:
    r = psVar76;
    local_80 = auVar62._8_8_;
    local_b8 = auVar62._0_8_;
    local_a0 = auVar61._8_8_;
    local_40 = auVar61._0_8_;
    uVar72 = auVar63._8_8_;
    uVar70 = auVar63._0_8_;
    pcStack_c0 = (code *)0x13f9c4;
    secp256k1_fe_mul_cold_3();
    auVar62._8_8_ = local_80;
    auVar62._0_8_ = local_b8;
    auVar61._8_8_ = local_a0;
    auVar61._0_8_ = local_40;
    auVar63._8_8_ = uVar72;
    auVar63._0_8_ = uVar70;
LAB_0013f9c4:
    local_80 = auVar62._8_8_;
    local_b8 = auVar62._0_8_;
    local_a0 = auVar61._8_8_;
    local_40 = auVar61._0_8_;
    a_00 = auVar63._8_8_;
    pcStack_c0 = (code *)0x13f9c9;
    secp256k1_fe_mul_cold_2();
    auVar62._8_8_ = local_80;
    auVar62._0_8_ = local_b8;
    auVar61._8_8_ = local_a0;
    auVar61._0_8_ = local_40;
  }
  else {
    if (a == b) goto LAB_0013f983;
    uVar1 = a->n[0];
    if (uVar1 >> 0x38 != 0) goto LAB_0013f988;
    unaff_R15 = 0xffffffffffffff;
    uVar2 = a->n[1];
    if (0xffffffffffffff < uVar2) goto LAB_0013f98d;
    psVar74 = (secp256k1_fe *)a->n[2];
    if ((secp256k1_fe *)0xffffffffffffff < psVar74) goto LAB_0013f992;
    uVar3 = a->n[3];
    if (0xffffffffffffff < uVar3) goto LAB_0013f997;
    uVar71 = a->n[4];
    if (uVar71 >> 0x34 != 0) goto LAB_0013f99c;
    a = (secp256k1_fe *)b->n[0];
    if ((secp256k1_fe *)0xffffffffffffff < a) goto LAB_0013f9a1;
    unaff_RBP = b->n[1];
    if (0xffffffffffffff < unaff_RBP) goto LAB_0013f9a6;
    uVar4 = b->n[2];
    if (0xffffffffffffff < uVar4) goto LAB_0013f9ab;
    uVar5 = b->n[3];
    if (0xffffffffffffff < uVar5) goto LAB_0013f9b0;
    uVar69 = b->n[4];
    uVar68 = unaff_RBP;
    if (0xfffffffffffff < uVar69) goto LAB_0013f9b5;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar5;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar4;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_RBP;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = psVar74;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = a;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar69;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar71;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(auVar10 * auVar40,0);
    auVar6 = auVar11 * ZEXT816(0x1000003d10) +
             auVar6 * auVar36 + auVar7 * auVar37 + auVar9 * auVar39 + auVar8 * auVar38;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar69;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar1;
    local_98 = SUB168(auVar12 * auVar41,0);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar5;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar2;
    auVar61 = auVar13 * auVar42;
    local_a0 = auVar61._8_8_;
    local_40 = auVar61._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar4;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = psVar74;
    local_48 = SUB168(auVar14 * auVar43,8);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_RBP;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar3;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = a;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar71;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = SUB168(auVar10 * auVar40,8);
    auVar7 = auVar17 * ZEXT816(0x1000003d10000) +
             auVar12 * auVar41 + auVar61 + auVar14 * auVar43 + auVar16 * auVar45 + auVar15 * auVar44
             + (auVar6 >> 0x34);
    local_90._8_8_ = 0;
    local_90._0_8_ = a;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar1;
    local_90 = local_90 * auVar46;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar69;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar2;
    auVar62 = auVar18 * auVar47;
    local_80 = auVar62._8_8_;
    local_b8 = auVar62._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar5;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = psVar74;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar4;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar3;
    uVar68 = SUB168(auVar20 * auVar49,0);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = unaff_RBP;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar71;
    auVar77 = (auVar7 >> 0x34) + auVar62 + auVar19 * auVar48 + auVar21 * auVar50 + auVar20 * auVar49
    ;
    unaff_R15 = auVar77._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar7._6_2_ & 0xf);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = unaff_R15;
    auVar8 = auVar22 * ZEXT816(0x1000003d1) + local_90;
    uVar69 = auVar8._0_8_;
    uVar75 = auVar8._8_8_;
    r->n[0] = uVar69 & 0xfffffffffffff;
    auVar64._8_8_ = uVar75 >> 0x34;
    auVar64._0_8_ = uVar75 * 0x1000 | uVar69 >> 0x34;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar1;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = b->n[1];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar2;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = b->n[0];
    auVar8 = auVar23 * auVar51 + auVar64 + auVar24 * auVar52;
    a = auVar8._0_8_;
    psVar76 = SUB168(auVar19 * auVar48,0);
    local_b0 = uVar71;
    local_a8 = uVar2;
    local_78 = uVar3;
    local_70 = psVar74;
    local_68 = uVar1;
    local_60 = r;
    local_58 = uVar5;
    local_50 = uVar4;
    local_38 = unaff_RBP;
    if (auVar8._8_8_ >> 0x32 != 0) goto LAB_0013f9ba;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = psVar74;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = b->n[4];
    auVar77 = auVar25 * auVar53 + (auVar77 >> 0x34);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar3;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = b->n[3];
    auVar65 = auVar26 * auVar54 + auVar77;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar71;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = b->n[2];
    auVar63 = auVar27 * auVar55 + auVar77 + auVar26 * auVar54;
    psVar76 = (secp256k1_fe *)0xffffffffffffffff;
    if (0x3ffffffffffff < auVar63._8_8_) goto LAB_0013f9bf;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = auVar63._0_8_ & 0xfffffffffffff;
    auVar8 = auVar8 + auVar28 * ZEXT816(0x1000003d10);
    r->n[1] = auVar8._0_8_ & 0xfffffffffffff;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar1;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = b->n[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar2;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = b->n[1];
    auVar77 = auVar29 * auVar56 + (auVar8 >> 0x34) + auVar30 * auVar57;
    auVar65._8_8_ = 0xfffffffffffff;
    auVar65._0_8_ = auVar77._0_8_;
    a = auVar77._8_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = psVar74;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = b->n[0];
    auVar77 = auVar77 + auVar31 * auVar58;
    if (0x3ffffffffffff < auVar77._8_8_) goto LAB_0013f9c4;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar3;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = b->n[4];
    auVar8 = auVar32 * auVar59 + (auVar63 >> 0x34);
    a = auVar8._8_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar71;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = b->n[3];
    auVar8 = auVar8 + auVar33 * auVar60;
    a_00 = auVar8._8_8_;
    if (a_00 < (secp256k1_ge *)0x4000000000000) {
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar8._0_8_;
      auVar77 = auVar77 + auVar34 * ZEXT816(0x1000003d10);
      auVar61 = auVar77 >> 0x34;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = auVar61._0_8_;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = a_00;
      auVar66._8_8_ = auVar61._8_8_;
      auVar66._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
      r->n[2] = auVar77._0_8_ & 0xfffffffffffff;
      auVar67 = auVar35 * ZEXT816(0x1000003d10000) + auVar66 + auVar67;
      uVar71 = auVar67._0_8_;
      r->n[3] = uVar71 & 0xfffffffffffff;
      r->n[4] = (auVar67._8_8_ << 0xc | uVar71 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
      r->magnitude = 1;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  local_80 = auVar62._8_8_;
  local_b8 = auVar62._0_8_;
  local_a0 = auVar61._8_8_;
  local_40 = auVar61._0_8_;
  pcStack_c0 = secp256k1_ge_to_storage;
  secp256k1_fe_mul_cold_1();
  a_01 = (secp256k1_ge *)auStack_130;
  psVar73 = a_00;
  r_00 = a_00;
  psStack_d0 = a;
  psStack_c8 = b;
  pcStack_c0 = (code *)auVar65._0_8_;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    auStack_130._48_8_ = (a_00->x).n[0];
    uStack_f8 = (a_00->x).n[1];
    uStack_f0 = (a_00->x).n[2];
    uStack_e8 = (a_00->x).n[3];
    uStack_e0 = (a_00->x).n[4];
    uStack_d8._0_4_ = (a_00->x).magnitude;
    iStack_d4 = (a_00->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_130 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_130._0_8_ = (a_00->y).n[0];
    auStack_130._8_8_ = (a_00->y).n[1];
    auStack_130._16_8_ = (a_00->y).n[2];
    auStack_130._24_8_ = (a_00->y).n[3];
    auStack_130._32_8_ = (a_00->y).n[4];
    auStack_130._40_4_ = (a_00->y).magnitude;
    auStack_130._44_4_ = (a_00->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_130);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_d4 != 0) {
      r->n[0] = uStack_f8 << 0x34 | auStack_130._48_8_;
      r->n[1] = uStack_f0 << 0x28 | uStack_f8 >> 0xc;
      r->n[2] = uStack_e8 << 0x1c | uStack_f0 >> 0x18;
      r->n[3] = uStack_e0 << 0x10 | uStack_e8 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_130);
      if (auStack_130._44_4_ != 0) {
        r->n[4] = auStack_130._8_8_ << 0x34 | auStack_130._0_8_;
        uVar71 = auStack_130._16_8_ << 0x28 | (ulong)auStack_130._8_8_ >> 0xc;
        r->magnitude = (int)uVar71;
        r->normalized = (int)(uVar71 >> 0x20);
        r[1].n[0] = auStack_130._24_8_ << 0x1c | (ulong)auStack_130._16_8_ >> 0x18;
        r[1].n[1] = auStack_130._32_8_ << 0x10 | (ulong)auStack_130._24_8_ >> 0x24;
        return;
      }
      goto LAB_0013fb20;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_01 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_0013fb20:
  secp256k1_ge_to_storage_cold_2();
  (a_01->x).n[0] = (psVar73->x).n[0] & 0xfffffffffffff;
  (a_01->x).n[1] = ((psVar73->x).n[1] & 0xffffffffff) << 0xc | (psVar73->x).n[0] >> 0x34;
  (a_01->x).n[2] = ((psVar73->x).n[2] & 0xfffffff) << 0x18 | (psVar73->x).n[1] >> 0x28;
  (a_01->x).n[3] = ((psVar73->x).n[3] & 0xffff) << 0x24 | (psVar73->x).n[2] >> 0x1c;
  (a_01->x).n[4] = (psVar73->x).n[3] >> 0x10;
  (a_01->x).magnitude = 1;
  (a_01->x).normalized = 1;
  secp256k1_fe_verify(&a_01->x);
  (a_01->y).n[0] = (psVar73->x).n[4] & 0xfffffffffffff;
  uVar71._0_4_ = (psVar73->x).magnitude;
  uVar71._4_4_ = (psVar73->x).normalized;
  (a_01->y).n[1] = (uVar71 & 0xffffffffff) << 0xc | (psVar73->x).n[4] >> 0x34;
  uVar1._0_4_ = (psVar73->x).magnitude;
  uVar1._4_4_ = (psVar73->x).normalized;
  (a_01->y).n[2] = ((psVar73->y).n[0] & 0xfffffff) << 0x18 | uVar1 >> 0x28;
  (a_01->y).n[3] = ((psVar73->y).n[1] & 0xffff) << 0x24 | (psVar73->y).n[0] >> 0x1c;
  (a_01->y).n[4] = (psVar73->y).n[1] >> 0x10;
  (a_01->y).magnitude = 1;
  (a_01->y).normalized = 1;
  secp256k1_fe_verify(&a_01->y);
  a_01->infinity = 0;
  secp256k1_ge_verify(a_01);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}